

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O2

void __thiscall cppnet::BufferBlock::~BufferBlock(BufferBlock *this)

{
  void *m;
  shared_ptr<cppnet::BlockMemoryPool> alloter;
  __shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferBlock_00125bc8;
  (this->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot = (_func_int **)&DAT_00125c58;
  if (this->_buffer_start != (char *)0x0) {
    std::__shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,&this->_alloter);
    if (local_20._M_ptr != (element_type *)0x0) {
      (*(local_20._M_ptr)->_vptr_BlockMemoryPool[3])();
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->_alloter).super___weak_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ListSlot<cppnet::BufferBlock>::~ListSlot(&this->super_ListSlot<cppnet::BufferBlock>);
  return;
}

Assistant:

BufferBlock::~BufferBlock() {
    if (_buffer_start) {
        auto alloter = _alloter.lock();
        if (alloter) {
            void* m = (void*)_buffer_start;
            alloter->PoolLargeFree(m);
        }
    }
}